

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O2

void textfile_bang(t_qlist *x)

{
  _outlet *x_00;
  uint uVar1;
  t_atom *ptVar2;
  uint uVar3;
  t_atom *ptVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar1 = binbuf_getnatom((x->x_textbuf).b_binbuf);
  uVar5 = x->x_onset;
  uVar8 = (ulong)(int)uVar5;
  ptVar2 = binbuf_getvec((x->x_textbuf).b_binbuf);
  ptVar2 = ptVar2 + uVar8;
  if ((int)uVar5 < (int)uVar1) {
    uVar5 = uVar1;
  }
  for (; (uVar7 = (uint)uVar8, uVar6 = uVar5, (int)uVar7 < (int)uVar1 &&
         (uVar6 = uVar7, (ptVar2->a_type & ~A_FLOAT) == A_SEMI)); ptVar2 = ptVar2 + 1) {
    uVar8 = (ulong)(uVar7 + 1);
  }
  ptVar4 = ptVar2;
  uVar7 = uVar6;
  uVar5 = uVar6;
  if ((int)uVar6 < (int)uVar1) {
    uVar5 = uVar1;
  }
  for (; (uVar3 = uVar5, (int)uVar7 < (int)uVar1 &&
         (uVar3 = uVar7, (ptVar4->a_type & ~A_FLOAT) != A_SEMI)); ptVar4 = ptVar4 + 1) {
    uVar7 = uVar7 + 1;
  }
  if (uVar3 - uVar6 != 0 && (int)uVar6 <= (int)uVar3) {
    x->x_onset = uVar3;
    x_00 = (x->x_textbuf).b_ob.te_outlet;
    if (ptVar2->a_type != A_SYMBOL) {
      outlet_list(x_00,(t_symbol *)0x0,uVar3 - uVar6,ptVar2);
      return;
    }
    outlet_anything(x_00,(ptVar2->a_w).w_symbol,uVar3 + ~uVar6,ptVar2 + 1);
    return;
  }
  x->x_onset = 0x7fffffff;
  outlet_bang(x->x_bangout);
  return;
}

Assistant:

static void textfile_bang(t_qlist *x)
{
    int argc = binbuf_getnatom(x->x_binbuf),
        onset = x->x_onset, onset2;
    t_atom *argv = binbuf_getvec(x->x_binbuf);
    t_atom *ap = argv + onset, *ap2;
    while (onset < argc &&
        (ap->a_type == A_SEMI || ap->a_type == A_COMMA))
            onset++, ap++;
    onset2 = onset;
    ap2 = ap;
    while (onset2 < argc &&
        (ap2->a_type != A_SEMI && ap2->a_type != A_COMMA))
            onset2++, ap2++;
    if (onset2 > onset)
    {
        x->x_onset = onset2;
        if (ap->a_type == A_SYMBOL)
            outlet_anything(x->x_ob.ob_outlet, ap->a_w.w_symbol,
                onset2-onset-1, ap+1);
        else outlet_list(x->x_ob.ob_outlet, 0, onset2-onset, ap);
    }
    else
    {
        x->x_onset = 0x7fffffff;
        outlet_bang(x->x_bangout);
    }
}